

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::processLine(Binasc *this,ostream *out,string *input,int lineCount)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int index;
  int iVar4;
  long lVar5;
  int iVar6;
  char cVar7;
  string *psVar8;
  Binasc *pBVar9;
  string word;
  undefined1 local_70 [32];
  string local_50;
  
  iVar2 = (int)input->_M_string_length;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if (iVar2 < 1) {
    iVar6 = 1;
  }
  else {
    index = 0;
    iVar6 = 1;
    do {
      bVar1 = (input->_M_dataplus)._M_p[index];
      uVar3 = (uint)bVar1;
      if (bVar1 < 0x2b) {
        if (bVar1 < 0x20) {
          if (uVar3 - 9 < 2) goto LAB_0011bd42;
LAB_0011be2d:
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \n\t","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          cVar7 = (char)&local_50;
          psVar8 = &local_50;
          lVar5 = std::__cxx11::string::find(cVar7,0x27);
          if (lVar5 == -1) {
            psVar8 = &local_50;
            lVar5 = std::__cxx11::string::find(cVar7,0x2c);
            if ((lVar5 == -1) && (local_50._M_string_length < 3)) {
              iVar4 = processHexWord((Binasc *)psVar8,out,&local_50,lineCount);
            }
            else {
              iVar4 = processBinaryWord((Binasc *)psVar8,out,&local_50,lineCount);
            }
          }
          else {
            iVar4 = processDecimalWord((Binasc *)psVar8,out,&local_50,lineCount);
          }
          goto LAB_0011bee3;
        }
        if (uVar3 == 0x20) {
LAB_0011bd42:
          index = index + 1;
        }
        else {
          if (uVar3 != 0x22) {
            if (uVar3 != 0x23) goto LAB_0011be2d;
            break;
          }
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"\"","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,local_50._M_dataplus._M_p,local_50._M_string_length);
        }
      }
      else {
        if (uVar3 == 0x6f || bVar1 < 0x6f) {
          if (uVar3 != 0x2b) {
            if ((uVar3 != 0x2f) && (uVar3 != 0x3b)) goto LAB_0011be2d;
            break;
          }
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \n\t","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          pBVar9 = (Binasc *)local_70._0_8_;
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          iVar4 = processAsciiWord(pBVar9,out,&local_50,lineCount);
        }
        else if (uVar3 == 0x70) {
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \n\t","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          pBVar9 = (Binasc *)local_70._0_8_;
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          iVar4 = processMidiPitchBendWord(pBVar9,out,&local_50,lineCount);
        }
        else if (uVar3 == 0x74) {
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \n\t","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          pBVar9 = (Binasc *)local_70._0_8_;
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          iVar4 = processMidiTempoWord(pBVar9,out,&local_50,lineCount);
        }
        else {
          if (uVar3 != 0x76) goto LAB_0011be2d;
          local_70._0_8_ = local_70 + 0x10;
          psVar8 = (string *)local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_70," \n\t","");
          index = getWord((Binasc *)psVar8,&local_50,input,(string *)local_70,index);
          pBVar9 = (Binasc *)local_70._0_8_;
          if ((Binasc *)local_70._0_8_ != (Binasc *)(local_70 + 0x10)) {
            operator_delete((void *)local_70._0_8_);
          }
          iVar4 = processVlvWord(pBVar9,out,&local_50,lineCount);
        }
LAB_0011bee3:
        if (iVar4 == 0) {
          iVar6 = 0;
          break;
        }
      }
    } while (index < iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return iVar6;
}

Assistant:

int Binasc::processLine(std::ostream& out, const std::string& input,
		int lineCount) {
	int status = 1;
	int i = 0;
	int length = (int)input.size();
	std::string word;
	while (i<length) {
		if ((input[i] == ';') || (input[i] == '#') || (input[i] == '/')) {
			// comment to end of line, so ignore
			return 1;
		} else if ((input[i] == ' ') || (input[i] == '\n')
				|| (input[i] == '\t')) {
			// ignore whitespace
			i++;
			continue;
		} else if (input[i] == '+') {
			i = getWord(word, input, " \n\t", i);
			status = processAsciiWord(out, word, lineCount);
		} else if (input[i] == '"') {
			i = getWord(word, input, "\"", i);
			status = processStringWord(out, word, lineCount);
		} else if (input[i] == 'v') {
			i = getWord(word, input, " \n\t", i);
			status = processVlvWord(out, word, lineCount);
		} else if (input[i] == 'p') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiPitchBendWord(out, word, lineCount);
		} else if (input[i] == 't') {
			i = getWord(word, input, " \n\t", i);
			status = processMidiTempoWord(out, word, lineCount);
		} else {
			i = getWord(word, input, " \n\t", i);
			if (word.find('\'') != std::string::npos) {
				status = processDecimalWord(out, word, lineCount);
			} else if ((word.find(',') != std::string::npos)
					|| (word.size() > 2)) {
				status = processBinaryWord(out, word, lineCount);
			} else {
				status = processHexWord(out, word, lineCount);
			}
		}

		if (status == 0) {
			return 0;
		}

	}

	return 1;
}